

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O3

void __thiscall
QtMWidgets::PageControlPrivate::updateButtonGeometryForLine(PageControlPrivate *this,int line)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pQVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  iVar1 = this->countInOneLine;
  iVar5 = iVar1;
  if (this->linesCount + -1 == line) {
    iVar5 = this->countInLastLine;
  }
  if (0 < iVar5) {
    iVar2 = this->buttonSize;
    iVar3 = this->widgetWidth;
    lVar6 = 0;
    do {
      iVar7 = this->buttonSize * (int)lVar6 + (iVar3 - iVar2 * iVar5) / 2;
      pQVar4 = QList<QRect>::operator[](&this->rectangles,iVar1 * line + lVar6);
      pQVar4->x1 = iVar7;
      pQVar4->y1 = iVar2 * line;
      pQVar4->x2 = iVar2 + -2 + iVar7;
      pQVar4->y2 = iVar2 * line + iVar2 + -2;
      lVar6 = lVar6 + 1;
    } while (iVar5 != (int)lVar6);
  }
  return;
}

Assistant:

void
PageControlPrivate::updateButtonGeometryForLine( int line )
{
	int count = countInOneLine;

	if( line == linesCount - 1 )
		count = countInLastLine;

	int index = line * countInOneLine;

	const int offset = ( widgetWidth - count * buttonSize ) / 2;

	const int y = line * buttonSize;

	const int size = buttonSize - 1;

	for( int i = 0; i < count; ++i )
	{
		rectangles[ index ] = QRect( offset + i * buttonSize, y,
			size, size );

		++index;
	}
}